

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_add_cast_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_type type)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  undefined4 in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  _Var1 = ggml_can_repeat_rows
                    ((ggml_tensor *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x765,"GGML_ASSERT(%s) failed","ggml_can_repeat_rows(b, a)");
  }
  _Var1 = ggml_is_quantized(in_RSI->type);
  if (((!_Var1) && (in_RSI->type != GGML_TYPE_F16)) && (in_RSI->type != GGML_TYPE_BF16)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x76a,"GGML_ASSERT(%s) failed",
               "ggml_is_quantized(a->type) || a->type == GGML_TYPE_F16 || a->type == GGML_TYPE_BF16"
              );
  }
  pgVar2 = ggml_new_tensor((ggml_context *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                           (ggml_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                           (int)in_stack_ffffffffffffffd8,(int64_t *)0x14af4c);
  pgVar2->op = GGML_OP_ADD;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  return pgVar2;
}

Assistant:

static struct ggml_tensor * ggml_add_cast_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        enum   ggml_type      type) {
    // TODO: support less-strict constraint
    //       GGML_ASSERT(ggml_can_repeat(b, a));
    GGML_ASSERT(ggml_can_repeat_rows(b, a));

    // currently only supported for quantized input and f16
    GGML_ASSERT(ggml_is_quantized(a->type) ||
                a->type == GGML_TYPE_F16 ||
                a->type == GGML_TYPE_BF16);

    struct ggml_tensor * result = ggml_new_tensor(ctx, type, GGML_MAX_DIMS, a->ne);

    result->op     = GGML_OP_ADD;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}